

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_reader.cpp
# Opt level: O0

bool __thiscall Json::Reader::decodeDouble(Reader *this,Token *token)

{
  bool bVar1;
  Value *this_00;
  long in_RSI;
  long in_RDI;
  Value decoded;
  Value *in_stack_00000218;
  Token *in_stack_00000220;
  Reader *in_stack_00000228;
  Value *in_stack_ffffffffffffff78;
  Value *in_stack_ffffffffffffff80;
  ValueType in_stack_ffffffffffffffac;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  
  Value::Value((Value *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
               in_stack_ffffffffffffffac);
  bVar1 = decodeDouble(in_stack_00000228,in_stack_00000220,in_stack_00000218);
  if (bVar1) {
    currentValue((Reader *)0x1e991c);
    Value::swapPayload(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    this_00 = currentValue((Reader *)0x1e993e);
    Value::setOffsetStart(this_00,*(long *)(in_RSI + 8) - *(long *)(in_RDI + 0xc0));
    in_stack_ffffffffffffff80 = currentValue((Reader *)0x1e9973);
    Value::setOffsetLimit
              (in_stack_ffffffffffffff80,*(long *)(in_RSI + 0x10) - *(long *)(in_RDI + 0xc0));
  }
  Value::~Value(in_stack_ffffffffffffff80);
  return bVar1;
}

Assistant:

bool Reader::decodeDouble(Token& token) {
  Value decoded;
  if (!decodeDouble(token, decoded))
    return false;
  currentValue().swapPayload(decoded);
  currentValue().setOffsetStart(token.start_ - begin_);
  currentValue().setOffsetLimit(token.end_ - begin_);
  return true;
}